

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemFromBtree(BtCursor *pCur,int offset,int amt,int key,Mem *pMem)

{
  int local_38;
  int local_34;
  int rc;
  int available;
  char *zData;
  Mem *pMem_local;
  u32 local_18;
  int key_local;
  int amt_local;
  int offset_local;
  BtCursor *pCur_local;
  
  local_34 = 0;
  local_38 = 0;
  zData = (char *)pMem;
  pMem_local._4_4_ = key;
  local_18 = amt;
  key_local = offset;
  _amt_local = pCur;
  if (key == 0) {
    _rc = sqlite3BtreeDataFetch(pCur,&local_34);
  }
  else {
    _rc = sqlite3BtreeKeyFetch(pCur,&local_34);
  }
  if ((local_34 < (int)(key_local + local_18)) || ((*(ushort *)(zData + 0x24) & 0x400) != 0)) {
    local_38 = sqlite3VdbeMemGrow((Mem *)zData,local_18 + 2,0);
    if (local_38 == 0) {
      builtin_strncpy(zData + 0x24,"\x10\x06\x04",4);
      if (pMem_local._4_4_ == 0) {
        local_38 = sqlite3BtreeData(_amt_local,key_local,local_18,*(void **)(zData + 8));
      }
      else {
        local_38 = sqlite3BtreeKey(_amt_local,key_local,local_18,*(void **)(zData + 8));
      }
      *(undefined1 *)(*(long *)(zData + 8) + (long)(int)local_18) = 0;
      *(undefined1 *)(*(long *)(zData + 8) + (long)(int)(local_18 + 1)) = 0;
      if (local_38 != 0) {
        sqlite3VdbeMemRelease((Mem *)zData);
      }
    }
  }
  else {
    sqlite3VdbeMemRelease((Mem *)zData);
    *(long *)(zData + 8) = (long)_rc + (long)key_local;
    zData[0x24] = '\x10';
    zData[0x25] = '\x10';
  }
  *(u32 *)(zData + 0x20) = local_18;
  return local_38;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtree(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  int offset,       /* Offset from the start of data to return bytes from. */
  int amt,          /* Number of bytes to return. */
  int key,          /* If true, retrieve from the btree key, not data. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  char *zData;        /* Data from the btree layer */
  int available = 0;  /* Number of bytes available on the local btree page */
  int rc = SQLITE_OK; /* Return code */

  assert( sqlite3BtreeCursorIsValid(pCur) );

  /* Note: the calls to BtreeKeyFetch() and DataFetch() below assert() 
  ** that both the BtShared and database handle mutexes are held. */
  assert( (pMem->flags & MEM_RowSet)==0 );
  if( key ){
    zData = (char *)sqlite3BtreeKeyFetch(pCur, &available);
  }else{
    zData = (char *)sqlite3BtreeDataFetch(pCur, &available);
  }
  assert( zData!=0 );

  if( offset+amt<=available && (pMem->flags&MEM_Dyn)==0 ){
    sqlite3VdbeMemRelease(pMem);
    pMem->z = &zData[offset];
    pMem->flags = MEM_Blob|MEM_Ephem;
  }else if( SQLITE_OK==(rc = sqlite3VdbeMemGrow(pMem, amt+2, 0)) ){
    pMem->flags = MEM_Blob|MEM_Dyn|MEM_Term;
    pMem->enc = 0;
    pMem->type = SQLITE_BLOB;
    if( key ){
      rc = sqlite3BtreeKey(pCur, offset, amt, pMem->z);
    }else{
      rc = sqlite3BtreeData(pCur, offset, amt, pMem->z);
    }
    pMem->z[amt] = 0;
    pMem->z[amt+1] = 0;
    if( rc!=SQLITE_OK ){
      sqlite3VdbeMemRelease(pMem);
    }
  }
  pMem->n = amt;

  return rc;
}